

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

nng_err nng_init(nng_init_params *params)

{
  _Bool _Var1;
  short sVar2;
  short sVar3;
  int iVar4;
  nng_err nVar5;
  char *pcVar6;
  
  do {
    _Var1 = nni_atomic_flag_test_and_set(&init_busy);
  } while (_Var1);
  if (init_count != 0) {
    if (params != (nng_init_params *)0x0) {
      nni_atomic_flag_reset(&init_busy);
      return NNG_EBUSY;
    }
    init_count = init_count + 1;
    nni_atomic_flag_reset(&init_busy);
    return NNG_OK;
  }
  if (params == (nng_init_params *)0x0) {
    iVar4 = nni_plat_ncpu();
    init_params.num_task_threads = (short)iVar4 * 2;
    init_params.max_task_threads = 0x10;
    iVar4 = nni_plat_ncpu();
    init_params.num_expire_threads = (int16_t)iVar4;
    init_params.max_expire_threads = 8;
    iVar4 = nni_plat_ncpu();
    init_params.max_poller_threads = 8;
    init_params.num_poller_threads = (int16_t)iVar4;
  }
  else {
    sVar2 = params->num_task_threads;
    if (sVar2 == 0) {
      iVar4 = nni_plat_ncpu();
      sVar2 = (short)iVar4 * 2;
    }
    init_params.max_task_threads = 0x10;
    if (params->max_task_threads != 0) {
      init_params.max_task_threads = params->max_task_threads;
    }
    sVar3 = params->num_expire_threads;
    init_params.num_task_threads = sVar2;
    if (sVar3 == 0) {
      iVar4 = nni_plat_ncpu();
      sVar3 = (short)iVar4;
    }
    init_params.max_expire_threads = params->max_expire_threads;
    if (params->max_expire_threads == 0) {
      init_params.max_expire_threads = 8;
    }
    sVar2 = params->num_poller_threads;
    init_params.num_expire_threads = sVar3;
    if (sVar2 == 0) {
      iVar4 = nni_plat_ncpu();
      sVar2 = (short)iVar4;
    }
    init_params.max_poller_threads = params->max_poller_threads;
    if (init_params.max_poller_threads == 0) {
      init_params.max_poller_threads = 8;
    }
    init_params.num_resolver_threads = params->num_resolver_threads;
    init_params.num_poller_threads = sVar2;
    if (init_params.num_resolver_threads != 0) goto LAB_00112d8a;
  }
  init_params.num_resolver_threads = 4;
LAB_00112d8a:
  nVar5 = nni_plat_init(&init_params);
  if ((((nVar5 == NNG_OK) && (nVar5 = nni_taskq_sys_init(&init_params), nVar5 == NNG_OK)) &&
      (nVar5 = nni_reap_sys_init(), nVar5 == NNG_OK)) &&
     ((nVar5 = nni_aio_sys_init(&init_params), nVar5 == NNG_OK &&
      (nVar5 = nni_tls_sys_init(), nVar5 == NNG_OK)))) {
    nni_sp_tran_sys_init();
    pcVar6 = nng_version();
    nVar5 = NNG_OK;
    nng_log_notice("NNG-INIT","NNG library version %s initialized",pcVar6);
    init_count = init_count + 1;
    nni_atomic_flag_reset(&init_busy);
  }
  else {
    nni_atomic_flag_reset(&init_busy);
    nng_fini();
  }
  return nVar5;
}

Assistant:

nng_err
nng_init(nng_init_params *params)
{
	nng_init_params zero = { 0 };
	nng_err         rv;

	// cheap spin lock
	while (nni_atomic_flag_test_and_set(&init_busy)) {
		continue;
	}
	if (init_count > 0) {
		if (params != NULL) {
			nni_atomic_flag_reset(&init_busy);
			return (NNG_EBUSY);
		}
		init_count++;
		nni_atomic_flag_reset(&init_busy);
		return (0);
	}
	if (params == NULL) {
		params = &zero;
	}
	init_params.num_task_threads     = params->num_task_threads
	        ? params->num_task_threads
	        : NNG_NUM_TASKQ_THREADS;
	init_params.max_task_threads     = params->max_task_threads
	        ? params->max_task_threads
	        : NNG_MAX_TASKQ_THREADS;
	init_params.num_expire_threads   = params->num_expire_threads
	      ? params->num_expire_threads
	      : NNG_NUM_EXPIRE_THREADS;
	init_params.max_expire_threads   = params->max_expire_threads
	      ? params->max_expire_threads
	      : NNG_MAX_EXPIRE_THREADS;
	init_params.num_poller_threads   = params->num_poller_threads
	      ? params->num_poller_threads
	      : NNG_NUM_POLLER_THREADS;
	init_params.max_poller_threads   = params->max_poller_threads
	      ? params->max_poller_threads
	      : NNG_MAX_POLLER_THREADS;
	init_params.num_resolver_threads = params->num_resolver_threads
	    ? params->num_resolver_threads
	    : NNG_RESOLV_CONCURRENCY;

	if (((rv = nni_plat_init(&init_params)) != 0) ||
	    ((rv = nni_taskq_sys_init(&init_params)) != 0) ||
	    ((rv = nni_reap_sys_init()) != 0) ||
	    ((rv = nni_aio_sys_init(&init_params)) != 0) ||
	    ((rv = nni_tls_sys_init()) != 0)) {
		nni_atomic_flag_reset(&init_busy);
		nng_fini();
		return (rv);
	}

	// following never fails
	nni_sp_tran_sys_init();

	nng_log_notice(
	    "NNG-INIT", "NNG library version %s initialized", nng_version());
	init_count++;
	nni_atomic_flag_reset(&init_busy);
	return (rv);
}